

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::check_quant_tables(jpeg_decoder *this)

{
  int local_14;
  int i;
  jpeg_decoder *this_local;
  
  local_14 = 0;
  while( true ) {
    if (this->m_comps_in_scan <= local_14) {
      return;
    }
    if (this->m_quant[this->m_comp_quant[this->m_comp_list[local_14]]] == (jpgd_quant_t *)0x0)
    break;
    local_14 = local_14 + 1;
  }
  stop_decoding(this,JPGD_UNDEFINED_QUANT_TABLE);
}

Assistant:

void jpeg_decoder::check_quant_tables()
	{
		for (int i = 0; i < m_comps_in_scan; i++)
			if (m_quant[m_comp_quant[m_comp_list[i]]] == nullptr)
				stop_decoding(JPGD_UNDEFINED_QUANT_TABLE);
	}